

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O2

String * __thiscall asl::String::trimmed(String *__return_storage_ptr__,String *this)

{
  byte bVar1;
  uint uVar2;
  anon_union_16_2_78e7fdac_for_String_2 *paVar3;
  ulong uVar4;
  int i;
  ulong uVar5;
  ulong uVar6;
  
  uVar2 = this->_len;
  uVar4 = (ulong)(int)uVar2;
  if (this->_size == 0) {
    paVar3 = &this->field_2;
  }
  else {
    paVar3 = (anon_union_16_2_78e7fdac_for_String_2 *)(this->field_2)._str;
  }
  uVar6 = 0;
  uVar5 = 0;
  if (0 < (int)uVar2) {
    uVar5 = (ulong)uVar2;
  }
  do {
    if (uVar5 == uVar6) {
LAB_001212bb:
      i = (int)uVar5;
      uVar6 = (ulong)uVar2;
      if (i < (int)uVar2) {
        uVar6 = uVar5;
      }
      while (((uVar5 = uVar6, (long)i < (long)uVar4 &&
              (bVar1 = paVar3->_space[uVar4 - 1], uVar5 = uVar4, (char)bVar1 < '!')) &&
             ((bVar1 < 0x21 && ((0x100002600U >> ((ulong)(uint)bVar1 & 0x3f) & 1) != 0))))) {
        uVar4 = uVar4 - 1;
      }
      substring(__return_storage_ptr__,this,i,(int)uVar5);
      return __return_storage_ptr__;
    }
    bVar1 = paVar3->_space[uVar6];
    if (((' ' < (char)bVar1) || (0x20 < bVar1)) ||
       ((0x100002600U >> ((ulong)(uint)bVar1 & 0x3f) & 1) == 0)) {
      uVar5 = uVar6 & 0xffffffff;
      goto LAB_001212bb;
    }
    uVar6 = uVar6 + 1;
  } while( true );
}

Assistant:

String String::trimmed() const
{
	int i,j, n=_len;
	const char* s = str();
	for(i=0; i<n; i++)
		if(!myisspace(s[i])) break;
	for(j=n-1; j>=i; j--)
		if(!myisspace(s[j])) break;
	return substring(i, j+1);
}